

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

void Col_RopeIterFirst(ColRopeIterator *it,Col_Word rope)

{
  size_t sVar1;
  Col_Word rope_local;
  ColRopeIterator *it_local;
  
  it->rope = rope;
  sVar1 = Col_RopeLength(rope);
  it->length = sVar1;
  it->index = 0;
  (it->chunk).first = 0xffffffffffffffff;
  return;
}

Assistant:

void
Col_RopeIterFirst(
    Col_RopeIterator it,    /*!< Iterator to initialize. */
    Col_Word rope)          /*!< Rope to iterate over. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) {
        Col_RopeIterSetNull(it);
        return;
    }

    it->rope = rope;
    it->length = Col_RopeLength(rope);
    it->index = 0;

    /*
     * Traversal info will be lazily computed.
     */

    it->chunk.first = SIZE_MAX;
}